

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  ulong uVar2;
  LookasideSlot *pLVar3;
  ulong uVar4;
  LookasideSlot *pLVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar1 = sqlite3LookasideUsed(db,(int *)0x0);
  if (iVar1 < 1) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    uVar7 = sz & 0xfffffff8;
    uVar2 = 0;
    uVar4 = (ulong)uVar7;
    if ((int)uVar7 < 9) {
      uVar4 = uVar2;
    }
    uVar6 = (ulong)(uint)cnt;
    if (cnt < 1) {
      uVar6 = uVar2;
    }
    if (cnt < 1 || (int)uVar7 < 9) {
      uVar4 = uVar2;
      pLVar3 = (LookasideSlot *)0x0;
    }
    else {
      pLVar3 = (LookasideSlot *)pBuf;
      if (pBuf == (void *)0x0) {
        if (sqlite3Hooks_0 != (code *)0x0) {
          (*sqlite3Hooks_0)();
        }
        pLVar3 = (LookasideSlot *)sqlite3Malloc(uVar6 * uVar7);
        if (sqlite3Hooks_1 != (code *)0x0) {
          (*sqlite3Hooks_1)();
        }
        if (pLVar3 == (LookasideSlot *)0x0) {
          pLVar3 = (LookasideSlot *)0x0;
        }
        else {
          iVar1 = (*sqlite3Config.m.xSize)(pLVar3);
          uVar6 = (long)iVar1 / (long)(int)uVar7 & 0xffffffff;
        }
      }
    }
    (db->lookaside).pStart = pLVar3;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar4;
    if (pLVar3 == (LookasideSlot *)0x0) {
      (db->lookaside).pStart = db;
      (db->lookaside).pEnd = db;
      (db->lookaside).bDisable = 1;
      (db->lookaside).bMalloced = '\0';
      (db->lookaside).nSlot = 0;
    }
    else {
      (db->lookaside).nSlot = (u32)uVar6;
      pLVar5 = (LookasideSlot *)0x0;
      for (; 0 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
        pLVar3->pNext = pLVar5;
        (db->lookaside).pInit = pLVar3;
        pLVar5 = pLVar3;
        pLVar3 = (LookasideSlot *)((long)&pLVar3->pNext + uVar4);
      }
      (db->lookaside).pEnd = pLVar3;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 5;
  }
  return iVar1;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  
  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*(sqlite3_int64)cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    db->lookaside.nSlot = cnt;
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pStart = db;
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}